

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropon.c
# Opt level: O2

void mj_free_component(mj_component_t *c)

{
  long lVar1;
  
  if (c != (mj_component_t *)0x0) {
    for (lVar1 = 0; lVar1 < c->nblocks; lVar1 = lVar1 + 1) {
      free(c->blocks[lVar1]);
    }
    free(c->blocks);
    return;
  }
  return;
}

Assistant:

void mj_free_component(mj_component_t *c) {
    if(c == NULL) {
        return;
    }

    int i;

    for(i = 0; i < c->nblocks; i++) {
        free(c->blocks[i]);
    }

    free(c->blocks);

    return;
}